

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

void __thiscall
slang::DiagnosticEngine::setMessage(DiagnosticEngine *this,DiagCode code,string *message)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ulong pos0;
  value_type_pointer ppVar7;
  ulong uVar8;
  uint uVar9;
  ulong hash;
  long lVar10;
  ulong uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  undefined1 auVar16 [16];
  locator res;
  try_emplace_args_t local_65;
  DiagCode local_64;
  flat_hash_map<DiagCode,_std::string> *local_60;
  ulong local_58;
  string *local_50;
  locator local_48;
  
  local_60 = &this->messageTable;
  local_64.code = code.code;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (ulong)local_64.code | (ulong)(uint)((int)code << 0x10);
  hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->messageTable).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->messageTable).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar7 = (this->messageTable).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
           .arrays.elements_;
  local_58 = (this->messageTable).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
             .arrays.groups_size_mask;
  uVar8 = 0;
  uVar11 = pos0;
  do {
    pgVar2 = pgVar4 + uVar11;
    uVar12 = (uchar)uVar3;
    auVar16[0] = -(pgVar2->m[0].n == uVar12);
    uVar13 = (uchar)((uint)uVar3 >> 8);
    auVar16[1] = -(pgVar2->m[1].n == uVar13);
    uVar14 = (uchar)((uint)uVar3 >> 0x10);
    auVar16[2] = -(pgVar2->m[2].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 0x18);
    auVar16[3] = -(pgVar2->m[3].n == uVar15);
    auVar16[4] = -(pgVar2->m[4].n == uVar12);
    auVar16[5] = -(pgVar2->m[5].n == uVar13);
    auVar16[6] = -(pgVar2->m[6].n == uVar14);
    auVar16[7] = -(pgVar2->m[7].n == uVar15);
    auVar16[8] = -(pgVar2->m[8].n == uVar12);
    auVar16[9] = -(pgVar2->m[9].n == uVar13);
    auVar16[10] = -(pgVar2->m[10].n == uVar14);
    auVar16[0xb] = -(pgVar2->m[0xb].n == uVar15);
    auVar16[0xc] = -(pgVar2->m[0xc].n == uVar12);
    auVar16[0xd] = -(pgVar2->m[0xd].n == uVar13);
    auVar16[0xe] = -(pgVar2->m[0xe].n == uVar14);
    auVar16[0xf] = -(pgVar2->m[0xf].n == uVar15);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
        uVar9 = uVar9 - 1 & uVar9) {
      uVar5 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if (code == ppVar7[uVar11 * 0xf + (ulong)uVar5].first) {
        ppVar7 = ppVar7 + uVar11 * 0xf + (ulong)uVar5;
        goto LAB_0013872f;
      }
    }
    if ((pgVar4[uVar11].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    lVar10 = uVar11 + uVar8;
    uVar8 = uVar8 + 1;
    uVar11 = lVar10 + 1U & local_58;
  } while (uVar8 <= local_58);
  ppVar7 = (value_type_pointer)0x0;
LAB_0013872f:
  local_64 = code;
  local_50 = message;
  if (ppVar7 == (value_type_pointer)0x0) {
    if ((this->messageTable).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
        .size_ctrl.size <
        (this->messageTable).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
                  *)local_60,(arrays_type *)local_60,pos0,hash,&local_65,&local_64);
      psVar1 = &(this->messageTable).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_std::__cxx11::basic_string<char>_>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_std::__cxx11::basic_string<char>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar7 = local_48.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::DiagCode_const&>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,std::__cxx11::string>>>
                  *)local_60,hash,&local_65,&local_64);
      ppVar7 = local_48.p;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&ppVar7->second,local_50);
  return;
}

Assistant:

void DiagnosticEngine::setMessage(DiagCode code, const std::string& message) {
    messageTable[code] = message;
}